

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxUnicode.cpp
# Opt level: O0

WString * Jinx::Impl::ConvertUtf8ToWString(WString *__return_storage_ptr__,String *utf8Str)

{
  char *pcVar1;
  size_type sVar2;
  size_t local_48;
  size_t numOut;
  char32_t utf32CodePoint;
  undefined1 local_29;
  char *local_28;
  char *cInStrEnd;
  char *cInStr;
  String *utf8Str_local;
  WString *outString;
  
  cInStr = (char *)utf8Str;
  utf8Str_local = (String *)__return_storage_ptr__;
  pcVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::c_str
                     (utf8Str);
  cInStrEnd = pcVar1;
  sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::size
                    ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)cInStr);
  local_28 = pcVar1 + sVar2;
  local_29 = 0;
  std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_Jinx::Allocator<wchar_t>_>::
  basic_string(__return_storage_ptr__);
  sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::size
                    ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)cInStr);
  std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_Jinx::Allocator<wchar_t>_>::reserve
            (__return_storage_ptr__,sVar2);
  numOut._0_4_ = L'\0';
  local_48 = 0;
  while (*cInStrEnd != '\0') {
    ConvertUtf8ToUtf32(cInStrEnd,(ulong)(uint)((int)local_28 - (int)cInStrEnd),(char32_t *)&numOut,
                       &local_48);
    cInStrEnd = cInStrEnd + local_48;
    std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_Jinx::Allocator<wchar_t>_>::
    operator+=(__return_storage_ptr__,(wchar_t)numOut);
  }
  return __return_storage_ptr__;
}

Assistant:

inline_t WString ConvertUtf8ToWString(const String & utf8Str)
	{
		// Compile-time check to determine size of wchar_t, and perform appropriate UTF-16 or UTF-32 conversion.
		if constexpr (sizeof(wchar_t) == 4)
		{
			const char * cInStr = utf8Str.c_str();
			const char * cInStrEnd = cInStr + utf8Str.size();
			WString outString;
			outString.reserve(utf8Str.size());
			char32_t utf32CodePoint = 0;
			size_t numOut = 0;
			while (*cInStr != 0)
			{
				Impl::ConvertUtf8ToUtf32(cInStr, (uint32_t)(cInStrEnd - cInStr), &utf32CodePoint, &numOut);
				cInStr += numOut;
				outString += static_cast<wchar_t>(utf32CodePoint);
			}
			return outString;
		}
		else
		{
			return reinterpret_cast<const wchar_t *>(ConvertUtf8ToUtf16(utf8Str).c_str());
		}
	}